

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

void __thiscall Assimp::Ogre::MeshXml::Reset(MeshXml *this)

{
  Skeleton *this_00;
  VertexDataXml *this_01;
  pointer ppSVar1;
  SubMeshXml *this_02;
  SubMeshXml **mesh;
  pointer ppSVar2;
  
  this_00 = this->skeleton;
  if (this_00 != (Skeleton *)0x0) {
    Skeleton::~Skeleton(this_00);
    operator_delete(this_00,0x38);
  }
  this->skeleton = (Skeleton *)0x0;
  this_01 = this->sharedVertexData;
  if (this_01 != (VertexDataXml *)0x0) {
    VertexDataXml::~VertexDataXml(this_01);
    operator_delete(this_01,0xe0);
  }
  this->sharedVertexData = (VertexDataXml *)0x0;
  ppSVar1 = (this->subMeshes).
            super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar2 = (this->subMeshes).
                 super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar2 != ppSVar1;
      ppSVar2 = ppSVar2 + 1) {
    this_02 = *ppSVar2;
    if (this_02 != (SubMeshXml *)0x0) {
      SubMeshXml::~SubMeshXml(this_02);
      operator_delete(this_02,0xa8);
    }
    *ppSVar2 = (SubMeshXml *)0x0;
  }
  ppSVar2 = (this->subMeshes).
            super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->subMeshes).
      super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppSVar2) {
    (this->subMeshes).
    super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppSVar2;
  }
  return;
}

Assistant:

void MeshXml::Reset()
{
    OGRE_SAFE_DELETE(skeleton)
    OGRE_SAFE_DELETE(sharedVertexData)

    for(auto &mesh : subMeshes) {
        OGRE_SAFE_DELETE(mesh)
    }
    subMeshes.clear();
}